

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewDelimiter(LocationUpdater *this,BinaryLocation oldAddr)

{
  const_iterator cVar1;
  uint *puVar2;
  BinaryLocation BVar3;
  undefined1 local_28 [8];
  DelimiterInfo info;
  
  _local_28 = AddrExprMap::getDelimiter(&this->oldExprAddrMap,oldAddr);
  BVar3 = 0;
  if (local_28 != (Expression *)0x0) {
    cVar1 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->newLocations->delimiters)._M_h,(key_type *)local_28);
    BVar3 = 0;
    if (cVar1.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      puVar2 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                         ((ZeroInitSmallVector<unsigned_int,_1UL> *)
                          ((long)cVar1.
                                 super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
                                 ._M_cur + 0x10),(size_t)info.expr);
      BVar3 = *puVar2;
    }
  }
  return BVar3;
}

Assistant:

BinaryLocation getNewDelimiter(BinaryLocation oldAddr) const {
    auto info = oldExprAddrMap.getDelimiter(oldAddr);
    if (info.expr) {
      auto iter = newLocations.delimiters.find(info.expr);
      if (iter != newLocations.delimiters.end()) {
        return iter->second[info.id];
      }
    }
    return 0;
  }